

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

int uECC_shared_secret(uint8_t *public_key,uint8_t *private_key,uint8_t *secret)

{
  uint64_t *native;
  int iVar1;
  uint uVar2;
  uECC_word_t uVar3;
  long lVar4;
  bitcount_t in_R8D;
  uECC_word_t *vli;
  bool bVar5;
  undefined1 local_128 [8];
  EccPoint product;
  EccPoint public;
  uECC_word_t random [4];
  uECC_word_t private [4];
  uECC_word_t tmp [4];
  uECC_word_t *p2 [2];
  
  tmp[3] = (uECC_word_t)(random + 3);
  lVar4 = 0x40;
  vli = public.y + 3;
  do {
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar5) {
      vli = (uECC_word_t *)0x0;
      break;
    }
    iVar1 = (*g_rng_function)((uint8_t *)vli,0x20);
  } while ((iVar1 == 0) || (uVar3 = vli_isZero(vli), uVar3 != 0));
  native = random + 3;
  vli_bytesToNative(native,private_key);
  vli_bytesToNative((uint64_t *)(product.y + 3),public_key);
  vli_bytesToNative(public.x + 3,public_key + 0x20);
  uVar3 = vli_add(native,native,curve_n);
  vli_add(private + 3,native,curve_n);
  EccPoint_mult((EccPoint *)local_128,(EccPoint *)(product.y + 3),
                (uECC_word_t *)tmp[(uVar3 ^ 1) + 3],vli,in_R8D);
  vli_nativeToBytes(secret,(uint64_t *)local_128);
  uVar2 = EccPoint_isZero((EccPoint *)local_128);
  return uVar2 ^ 1;
}

Assistant:

int uECC_shared_secret(const uint8_t public_key[uECC_BYTES*2],
                       const uint8_t private_key[uECC_BYTES],
                       uint8_t secret[uECC_BYTES]) {
    EccPoint public;
    EccPoint product;
    uECC_word_t private[uECC_WORDS];
    uECC_word_t tmp[uECC_WORDS];
    uECC_word_t *p2[2] = {private, tmp};
    uECC_word_t random[uECC_WORDS];
    uECC_word_t *initial_Z = 0;
    uECC_word_t tries;
    uECC_word_t carry;

    // Try to get a random initial Z value to improve protection against side-channel
    // attacks. If the RNG fails every time (eg it was not defined), we continue so that
    // uECC_shared_secret() can still work without an RNG defined.
    for (tries = 0; tries < MAX_TRIES; ++tries) {
        if (g_rng_function((uint8_t *)random, sizeof(random)) && !vli_isZero(random)) {
            initial_Z = random;
            break;
        }
    }

    vli_bytesToNative(private, private_key);
    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);

#if (uECC_CURVE == uECC_secp160r1)
    // Don't regularize the bitcount for secp160r1.
    EccPoint_mult(&product, &public, private, initial_Z, vli_numBits(private, uECC_WORDS));
#else
    // Regularize the bitcount for the private key so that attackers cannot use a side channel
    // attack to learn the number of leading zeros.
    carry = vli_add(private, private, curve_n);
    vli_add(tmp, private, curve_n);
    EccPoint_mult(&product, &public, p2[!carry], initial_Z, (uECC_BYTES * 8) + 1);
#endif

    vli_nativeToBytes(secret, product.x);
    return !EccPoint_isZero(&product);
}